

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_set_string_vector(exr_context_t ctxt,int part_index,char *name,int32_t size,char **val)

{
  undefined8 uVar1;
  exr_result_t eVar2;
  size_t sVar3;
  int in_ECX;
  exr_attribute_list_t *in_RDX;
  int in_ESI;
  char *in_RDI;
  long in_R8;
  exr_attribute_t **unaff_retaddr;
  int32_t i_3;
  int32_t i_2;
  size_t curlen;
  int32_t i_1;
  int32_t i;
  exr_priv_part_t part;
  exr_result_t rv;
  exr_attribute_t *attr;
  char *in_stack_ffffffffffffff88;
  char *pcVar4;
  undefined4 in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9d;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  int32_t nent;
  uint in_stack_ffffffffffffffc0;
  undefined4 uVar6;
  exr_context_t ctxt_00;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  ctxt_00 = (exr_const_context_t_conflict)0x0;
  uVar6 = 0;
  if (in_RDI == (char *)0x0) {
    local_4 = 2;
  }
  else {
    internal_exr_lock((exr_const_context_t_conflict)
                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if ((in_ESI < 0) || (*(int *)(in_RDI + 0xc4) <= in_ESI)) {
      internal_exr_unlock((exr_const_context_t_conflict)
                          CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      local_4 = (**(code **)(in_RDI + 0x48))(in_RDI,4,"Part index (%d) out of range",in_ESI);
    }
    else {
      pcVar4 = *(char **)(*(long *)(in_RDI + 0x1d8) + (long)in_ESI * 8);
      if (*in_RDI == '\0') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,8);
      }
      else if (*in_RDI == '\x03') {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        local_4 = (**(code **)(in_RDI + 0x38))(in_RDI,0x15);
      }
      else if (in_ECX < 0) {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,"Invalid size (%d) for string vector \'%s\'",in_ECX,in_RDX);
      }
      else if (in_R8 == 0) {
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        local_4 = (**(code **)(in_RDI + 0x48))
                            (in_RDI,3,
                             "No input string values for setting \'%s\', type \'stringvector\'",
                             in_RDX);
      }
      else {
        local_4 = exr_attr_list_find_by_name
                            (ctxt_00,(exr_attribute_list_t *)
                                     CONCAT44(uVar6,in_stack_ffffffffffffffc0),pcVar4,
                             (exr_attribute_t **)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        nent = (int32_t)((ulong)pcVar4 >> 0x20);
        if (local_4 == 0xf) {
          if (*in_RDI != '\x01') {
            internal_exr_unlock((exr_const_context_t_conflict)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            return local_4;
          }
          pcVar4 = &stack0xffffffffffffffc8;
          local_4 = exr_attr_list_add((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      in_RDX,(char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                      (exr_attribute_type_t)((ulong)in_R8 >> 0x20),(int32_t)in_R8,
                                      (uint8_t **)ctxt_00,unaff_retaddr);
          if (local_4 == 0) {
            local_4 = exr_attr_string_vector_init
                                (ctxt_00,(exr_attr_string_vector_t *)
                                         (ulong)in_stack_ffffffffffffffc0,nent);
          }
          for (iVar5 = 0; local_4 == 0 && iVar5 < in_ECX; iVar5 = iVar5 + 1) {
            local_4 = exr_attr_string_vector_set_entry
                                ((exr_context_t)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 (exr_attr_string_vector_t *)
                                 CONCAT17(local_4 == 0 && iVar5 < in_ECX,
                                          CONCAT16(in_stack_ffffffffffffff9e,
                                                   CONCAT15(in_stack_ffffffffffffff9d,
                                                            CONCAT14(in_stack_ffffffffffffff9c,
                                                                     in_stack_ffffffffffffff98)))),
                                 in_stack_ffffffffffffff94,pcVar4);
          }
        }
        else if (local_4 == 0) {
          if (*(int *)((long)&(ctxt_00->filename).str + 4) != 0x14) {
            internal_exr_unlock((exr_const_context_t_conflict)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            uVar1._0_4_ = (ctxt_00->filename).length;
            uVar1._4_4_ = (ctxt_00->filename).alloc_size;
            eVar2 = (**(code **)(in_RDI + 0x48))
                              (in_RDI,0x10,
                               "\'%s\' requested type \'stringvector\', but attribute is type \'%s\'"
                               ,in_RDX,uVar1);
            return eVar2;
          }
          if ((**(int **)&ctxt_00->tmp_filename == in_ECX) &&
             (0 < *(int *)(*(long *)&ctxt_00->tmp_filename + 4))) {
            if (*in_RDI == '\x01') {
              for (iVar5 = 0; local_4 == 0 && iVar5 < in_ECX; iVar5 = iVar5 + 1) {
                local_4 = exr_attr_string_vector_set_entry
                                    ((exr_context_t)CONCAT44(iVar5,in_stack_ffffffffffffffa0),
                                     (exr_attr_string_vector_t *)
                                     CONCAT17(in_stack_ffffffffffffff9f,
                                              CONCAT16(in_stack_ffffffffffffff9e,
                                                       CONCAT15(local_4 == 0 && iVar5 < in_ECX,
                                                                CONCAT14(in_stack_ffffffffffffff9c,
                                                                         in_stack_ffffffffffffff98))
                                                      )),in_stack_ffffffffffffff94,
                                     in_stack_ffffffffffffff88);
              }
            }
            else {
              for (iVar5 = 0; local_4 == 0 && iVar5 < in_ECX; iVar5 = iVar5 + 1) {
                if (*(long *)(in_R8 + (long)iVar5 * 8) == 0) {
                  internal_exr_unlock((exr_const_context_t_conflict)
                                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
                  ;
                  eVar2 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,3,"\'%s\' received NULL string in string vector",in_RDX)
                  ;
                  return eVar2;
                }
                sVar3 = strlen(*(char **)(in_R8 + (long)iVar5 * 8));
                if (sVar3 != (long)*(int *)(*(long *)(*(long *)&ctxt_00->tmp_filename + 8) +
                                           (long)iVar5 * 0x10)) {
                  internal_exr_unlock((exr_const_context_t_conflict)
                                      CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
                  ;
                  eVar2 = (**(code **)(in_RDI + 0x48))
                                    (in_RDI,3,
                                     "\'%s\' string %d in string vector is different size (old %d new %d), unable to update"
                                     ,in_RDX,iVar5,
                                     *(undefined4 *)
                                      (*(long *)(*(long *)&ctxt_00->tmp_filename + 8) +
                                      (long)iVar5 * 0x10),sVar3 & 0xffffffff);
                  return eVar2;
                }
                local_4 = exr_attr_string_vector_set_entry_with_length
                                    (ctxt_00,(exr_attr_string_vector_t *)
                                             CONCAT44(local_4,in_stack_ffffffffffffffc0),
                                     (int32_t)((ulong)pcVar4 >> 0x20),
                                     (char *)CONCAT44(in_stack_ffffffffffffffb4,iVar5),
                                     (int32_t)(sVar3 >> 0x20));
              }
            }
          }
          else {
            if (*in_RDI != '\x01') {
              internal_exr_unlock((exr_const_context_t_conflict)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              eVar2 = (**(code **)(in_RDI + 0x48))
                                (in_RDI,0x14,
                                 "Existing string vector \'%s\' has %d strings, but given %d, unable to change"
                                 ,in_RDX,**(undefined4 **)&ctxt_00->tmp_filename,in_ECX);
              return eVar2;
            }
            for (iVar5 = 0; local_4 == 0 && iVar5 < in_ECX; iVar5 = iVar5 + 1) {
              local_4 = exr_attr_string_vector_set_entry
                                  ((exr_context_t)CONCAT44(in_stack_ffffffffffffffa4,iVar5),
                                   (exr_attr_string_vector_t *)
                                   CONCAT17(in_stack_ffffffffffffff9f,
                                            CONCAT16(in_stack_ffffffffffffff9e,
                                                     CONCAT15(in_stack_ffffffffffffff9d,
                                                              CONCAT14(local_4 == 0 &&
                                                                       iVar5 < in_ECX,
                                                                       in_stack_ffffffffffffff98))))
                                   ,in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
            }
          }
        }
        internal_exr_unlock((exr_const_context_t_conflict)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_set_string_vector (
    exr_context_t ctxt,
    int           part_index,
    const char*   name,
    int32_t       size,
    const char**  val)
{
    exr_attribute_t* attr = NULL;
    exr_result_t     rv   = EXR_ERR_SUCCESS;

    EXR_LOCK_AND_DEFINE_PART (part_index);

    if (ctxt->mode == EXR_CONTEXT_READ)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));
    if (ctxt->mode == EXR_CONTEXT_WRITING_DATA)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_ALREADY_WROTE_ATTRS));

    if (size < 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid size (%d) for string vector '%s'",
            size,
            name));

    if (!val)
        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No input string values for setting '%s', type 'stringvector'",
            name));

    rv = exr_attr_list_find_by_name (
        ctxt, (exr_attribute_list_t*) &(part->attributes), name, &attr);

    if (rv == EXR_ERR_NO_ATTR_BY_NAME)
    {
        if (ctxt->mode != EXR_CONTEXT_WRITE) return EXR_UNLOCK_AND_RETURN (rv);

        rv = exr_attr_list_add (
            ctxt,
            &(part->attributes),
            name,
            EXR_ATTR_STRING_VECTOR,
            0,
            NULL,
            &(attr));
        if (rv == EXR_ERR_SUCCESS)
            rv = exr_attr_string_vector_init (ctxt, attr->stringvector, size);
        for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
            rv = exr_attr_string_vector_set_entry (
                ctxt, attr->stringvector, i, val[i]);
    }
    else if (rv == EXR_ERR_SUCCESS)
    {
        if (attr->type != EXR_ATTR_STRING_VECTOR)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_ATTR_TYPE_MISMATCH,
                "'%s' requested type 'stringvector', but attribute is type '%s'",
                name,
                attr->type_name));
        if (attr->stringvector->n_strings == size &&
            attr->stringvector->alloc_size > 0)
        {
            if (ctxt->mode != EXR_CONTEXT_WRITE)
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                {
                    size_t curlen;
                    if (!val[i])
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' received NULL string in string vector",
                            name));

                    curlen = strlen (val[i]);
                    if (curlen !=
                        (size_t) attr->stringvector->strings[i].length)
                        return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                            ctxt,
                            EXR_ERR_INVALID_ARGUMENT,
                            "'%s' string %d in string vector is different size (old %d new %d), unable to update",
                            name,
                            i,
                            attr->stringvector->strings[i].length,
                            (int32_t) curlen));

                    rv = exr_attr_string_vector_set_entry_with_length (
                        ctxt, attr->stringvector, i, val[i], (int32_t) curlen);
                }
            }
            else
            {
                for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                    rv = exr_attr_string_vector_set_entry (
                        ctxt, attr->stringvector, i, val[i]);
            }
        }
        else if (ctxt->mode != EXR_CONTEXT_WRITE)
        {
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MODIFY_SIZE_CHANGE,
                "Existing string vector '%s' has %d strings, but given %d, unable to change",
                name,
                attr->stringvector->n_strings,
                size));
        }
        else
        {
            for (int32_t i = 0; rv == EXR_ERR_SUCCESS && i < size; ++i)
                rv = exr_attr_string_vector_set_entry (
                    ctxt, attr->stringvector, i, val[i]);
        }
    }
    return EXR_UNLOCK_AND_RETURN (rv);
}